

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O2

void __thiscall
dynet::AttentionalModel<dynet::GRUBuilder>::AttentionalModel
          (AttentionalModel<dynet::GRUBuilder> *this,Model *model,uint vocab_size_src,
          uint _vocab_size_tgt,uint layers,uint hidden_dim,uint align_dim,bool _rnn_src_embeddings,
          bool _giza_positional,bool _giza_markov,bool _giza_fertility,bool _doc_context,
          bool _global_fertility)

{
  byte bVar1;
  int iVar2;
  undefined4 in_register_0000008c;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  initializer_list<unsigned_int> x_21;
  undefined1 local_b8 [16];
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined8 local_98;
  Dim local_8c;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  GRUBuilder *local_48;
  GRUBuilder *local_40;
  GRUBuilder *local_38;
  
  local_98 = CONCAT44(in_register_0000008c,hidden_dim);
  local_50 = (uint)_giza_fertility;
  local_54 = (uint)_giza_markov;
  local_58 = (uint)_giza_positional;
  local_4c = vocab_size_src;
  dynet::LookupParameter::LookupParameter(&this->p_cs);
  dynet::LookupParameter::LookupParameter(&this->p_ct);
  dynet::Parameter::Parameter(&this->p_R);
  dynet::Parameter::Parameter(&this->p_Q);
  dynet::Parameter::Parameter(&this->p_P);
  dynet::Parameter::Parameter(&this->p_S);
  dynet::Parameter::Parameter(&this->p_bias);
  dynet::Parameter::Parameter(&this->p_Wa);
  (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = &this->p_Wh0;
  (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dynet::Parameter::Parameter(&this->p_Ua);
  dynet::Parameter::Parameter(&this->p_va);
  dynet::Parameter::Parameter(&this->p_Ta);
  dynet::Parameter::Parameter(&this->p_Wfhid);
  dynet::Parameter::Parameter(&this->p_Wfmu);
  dynet::Parameter::Parameter(&this->p_Wfvar);
  dynet::Parameter::Parameter(&this->p_bfhid);
  dynet::Parameter::Parameter(&this->p_bfmu);
  dynet::Parameter::Parameter(&this->p_bfvar);
  local_38 = &this->builder;
  uVar4 = (uint)local_98;
  local_a4 = uVar4 * 2;
  uVar3 = uVar4 * 3;
  if (!_rnn_src_embeddings) {
    uVar3 = local_a4;
  }
  dynet::GRUBuilder::GRUBuilder(local_38,layers,uVar3,uVar4,model);
  uVar3 = (uint)local_98;
  local_5c = layers;
  dynet::GRUBuilder::GRUBuilder(&this->builder_src_fwd,1,uVar3,uVar3,model);
  local_48 = &this->builder_src_bwd;
  local_40 = &this->builder_src_fwd;
  dynet::GRUBuilder::GRUBuilder(local_48,1,uVar3,uVar3,model);
  auVar6 = vpbroadcastb_avx512vl(ZEXT116(1));
  this->rnn_src_embeddings = (bool)(_rnn_src_embeddings * auVar6[0]);
  this->giza_positional =
       (bool)(((byte)(_rnn_src_embeddings | (byte)((char)local_58 << 7) >> 6) >> 1) * auVar6[1]);
  this->giza_markov = (bool)(((byte)local_54 & 1) * auVar6[2]);
  this->giza_fertility = (bool)(((byte)local_50 & 1) * auVar6[3]);
  this->doc_context = _doc_context;
  this->global_fertility = _global_fertility;
  this->vocab_size_tgt = _vocab_size_tgt;
  (this->src).pg = (ComputationGraph *)0x0;
  (this->src).i.t = 0;
  (this->i_R).pg = (ComputationGraph *)0x0;
  (this->i_R).i.t = 0;
  (this->i_Q).pg = (ComputationGraph *)0x0;
  (this->i_Q).i.t = 0;
  (this->i_P).pg = (ComputationGraph *)0x0;
  (this->i_P).i.t = 0;
  (this->i_S).pg = (ComputationGraph *)0x0;
  (this->i_S).i.t = 0;
  (this->i_bias).pg = (ComputationGraph *)0x0;
  (this->i_bias).i.t = 0;
  (this->i_Wa).pg = (ComputationGraph *)0x0;
  (this->i_Wa).i.t = 0;
  (this->i_Ua).pg = (ComputationGraph *)0x0;
  (this->i_Ua).i.t = 0;
  (this->i_va).pg = (ComputationGraph *)0x0;
  (this->i_va).i.t = 0;
  (this->i_uax).pg = (ComputationGraph *)0x0;
  (this->i_uax).i.t = 0;
  (this->i_Ta).pg = (ComputationGraph *)0x0;
  (this->i_Ta).i.t = 0;
  (this->i_src_idx).pg = (ComputationGraph *)0x0;
  (this->i_src_idx).i.t = 0;
  (this->i_src_len).pg = (ComputationGraph *)0x0;
  (this->i_src_len).i.t = 0;
  (this->i_tt_ctx).pg = (ComputationGraph *)0x0;
  (this->i_tt_ctx).i.t = 0;
  *(undefined8 *)
   ((long)&(this->aligns).
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_vecs).
           super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_vecs).
           super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_vecs).
           super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->aligns).
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aligns).
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aligns).
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aux_vecs).
  super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  x._M_len = 1;
  x._M_array = (iterator)local_b8;
  local_b8._0_4_ = uVar3;
  Dim::Dim(&local_8c,x);
  auVar6 = dynet::Model::add_lookup_parameters((uint)model,(Dim *)(ulong)local_4c);
  this->p_cs = (LookupParameter)auVar6[0];
  *(long *)&this->field_0x1 = auVar6._1_8_;
  *(int7 *)&this->field_0x9 = auVar6._9_7_;
  uVar4 = this->vocab_size_tgt;
  local_b8._0_4_ = uVar3;
  x_00._M_len = 1;
  x_00._M_array = (iterator)local_b8;
  Dim::Dim(&local_8c,x_00);
  auVar6 = dynet::Model::add_lookup_parameters((uint)model,(Dim *)(ulong)uVar4);
  this->p_ct = (LookupParameter)auVar6[0];
  *(long *)&this->field_0x11 = auVar6._1_8_;
  *(int7 *)&this->field_0x19 = auVar6._9_7_;
  local_b8._4_4_ = uVar3;
  local_b8._0_4_ = this->vocab_size_tgt;
  x_01._M_len = 2;
  x_01._M_array = (iterator)local_b8;
  Dim::Dim(&local_8c,x_01);
  auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_R = (Parameter)auVar6[0];
  *(long *)&this->field_0x21 = auVar6._1_8_;
  *(int7 *)&this->field_0x29 = auVar6._9_7_;
  x_02._M_len = 2;
  x_02._M_array = (iterator)local_b8;
  local_b8._0_4_ = uVar3;
  Dim::Dim(&local_8c,x_02);
  auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_P = (Parameter)auVar6[0];
  *(long *)&this->field_0x41 = auVar6._1_8_;
  *(int7 *)&this->field_0x49 = auVar6._9_7_;
  local_b8._0_4_ = this->vocab_size_tgt;
  x_03._M_len = 1;
  x_03._M_array = (iterator)local_b8;
  Dim::Dim(&local_8c,x_03);
  auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  uVar4 = local_a4;
  this->p_bias = (Parameter)auVar6[0];
  *(long *)&this->field_0x61 = auVar6._1_8_;
  *(int7 *)&this->field_0x69 = auVar6._9_7_;
  local_b8._4_4_ = local_5c * uVar3;
  local_b8._0_4_ = align_dim;
  x_04._M_len = 2;
  x_04._M_array = (iterator)local_b8;
  Dim::Dim(&local_8c,x_04);
  auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wa = (Parameter)auVar6[0];
  *(long *)&this->field_0x71 = auVar6._1_8_;
  *(int7 *)&this->field_0x79 = auVar6._9_7_;
  if (this->rnn_src_embeddings == true) {
    local_b8._4_4_ = uVar4;
    x_05._M_len = 2;
    x_05._M_array = (iterator)local_b8;
    Dim::Dim(&local_8c,x_05);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Ua = (Parameter)auVar6[0];
    *(long *)&this->field_0x99 = auVar6._1_8_;
    *(int7 *)&this->field_0xa1 = auVar6._9_7_;
    local_b8._0_8_ = CONCAT44(uVar4,uVar3);
    x_06._M_len = 2;
    x_06._M_array = (iterator)local_b8;
    Dim::Dim(&local_8c,x_06);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  }
  else {
    local_b8._4_4_ = uVar3;
    x_07._M_len = 2;
    x_07._M_array = (iterator)local_b8;
    Dim::Dim(&local_8c,x_07);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Ua = (Parameter)auVar6[0];
    *(long *)&this->field_0x99 = auVar6._1_8_;
    *(int7 *)&this->field_0xa1 = auVar6._9_7_;
    local_b8._0_8_ = CONCAT44(uVar3,uVar3);
    x_08._M_len = 2;
    x_08._M_array = (iterator)local_b8;
    Dim::Dim(&local_8c,x_08);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  }
  this->p_Q = (Parameter)auVar6[0];
  *(long *)&this->field_0x31 = auVar6._1_8_;
  *(int7 *)&this->field_0x39 = auVar6._9_7_;
  if (this->giza_positional == false) {
    bVar1 = this->giza_fertility;
    if ((this->giza_markov & 1U) == 0) {
      iVar2 = 0;
      if ((bVar1 & 1) == 0) goto LAB_0014648f;
    }
    else {
      iVar2 = 3;
    }
  }
  else {
    bVar1 = this->giza_fertility;
    iVar2 = (this->giza_markov & 1) * 3 + 3;
  }
  local_b8._4_4_ = iVar2 + 3;
  if ((bVar1 & 1) == 0) {
    local_b8._4_4_ = iVar2;
  }
  x_09._M_len = 2;
  x_09._M_array = (iterator)local_b8;
  Dim::Dim(&local_8c,x_09);
  auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Ta = (Parameter)auVar6[0];
  *(long *)&this->field_0xb9 = auVar6._1_8_;
  *(int7 *)&this->field_0xc1 = auVar6._9_7_;
LAB_0014648f:
  x_10._M_len = 1;
  x_10._M_array = (iterator)local_b8;
  Dim::Dim(&local_8c,x_10);
  auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_va = (Parameter)auVar6[0];
  *(long *)&this->field_0xa9 = auVar6._1_8_;
  *(int7 *)&this->field_0xb1 = auVar6._9_7_;
  if (this->doc_context == true) {
    if (this->rnn_src_embeddings == true) {
      local_b8._0_8_ = CONCAT44(uVar4,uVar3);
      x_11._M_len = 2;
      x_11._M_array = (iterator)local_b8;
      Dim::Dim(&local_8c,x_11);
      auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    else {
      local_b8._0_8_ = CONCAT44(uVar3,uVar3);
      x_12._M_len = 2;
      x_12._M_array = (iterator)local_b8;
      Dim::Dim(&local_8c,x_12);
      auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    this->p_S = (Parameter)auVar6[0];
    *(long *)&this->field_0x51 = auVar6._1_8_;
    *(int7 *)&this->field_0x59 = auVar6._9_7_;
  }
  if (this->global_fertility == true) {
    if (this->rnn_src_embeddings == true) {
      local_b8._0_8_ = CONCAT44(uVar4,uVar3);
      x_13._M_len = 2;
      x_13._M_array = (iterator)local_b8;
      Dim::Dim(&local_8c,x_13);
      auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    else {
      local_b8._0_8_ = CONCAT44(uVar3,uVar3);
      x_14._M_len = 2;
      x_14._M_array = (iterator)local_b8;
      Dim::Dim(&local_8c,x_14);
      auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    this->p_Wfhid = (Parameter)auVar6[0];
    *(long *)&this->field_0xc9 = auVar6._1_8_;
    *(int7 *)&this->field_0xd1 = auVar6._9_7_;
    x_15._M_len = 1;
    x_15._M_array = (iterator)local_b8;
    local_b8._0_4_ = uVar3;
    Dim::Dim(&local_8c,x_15);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_bfhid = (Parameter)auVar6[0];
    *(long *)&this->field_0xf9 = auVar6._1_8_;
    *(int7 *)&this->field_0x101 = auVar6._9_7_;
    x_16._M_len = 1;
    x_16._M_array = (iterator)local_b8;
    local_b8._0_4_ = uVar3;
    Dim::Dim(&local_8c,x_16);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Wfmu = (Parameter)auVar6[0];
    *(long *)&this->field_0xd9 = auVar6._1_8_;
    *(int7 *)&this->field_0xe1 = auVar6._9_7_;
    local_b8._0_4_ = 1;
    x_17._M_len = 1;
    x_17._M_array = (iterator)local_b8;
    Dim::Dim(&local_8c,x_17);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_bfmu = (Parameter)auVar6[0];
    *(long *)&this->field_0x109 = auVar6._1_8_;
    *(int7 *)&this->field_0x111 = auVar6._9_7_;
    x_18._M_len = 1;
    x_18._M_array = (iterator)local_b8;
    local_b8._0_4_ = uVar3;
    Dim::Dim(&local_8c,x_18);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Wfvar = (Parameter)auVar6[0];
    *(long *)&this->field_0xe9 = auVar6._1_8_;
    *(int7 *)&this->field_0xf1 = auVar6._9_7_;
    local_b8._0_4_ = 1;
    x_19._M_len = 1;
    x_19._M_array = (iterator)local_b8;
    Dim::Dim(&local_8c,x_19);
    auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_bfvar = (Parameter)auVar6[0];
    *(long *)&this->field_0x119 = auVar6._1_8_;
    *(int7 *)&this->field_0x121 = auVar6._9_7_;
  }
  uVar4 = ~((int)*(uint *)&this->field_0x1bc >> 0x1f) & *(uint *)&this->field_0x1bc;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    local_a0 = (uint)local_98;
    if (this->rnn_src_embeddings == true) {
      local_9c = local_a4;
      x_20._M_len = 2;
      x_20._M_array = &local_a0;
      Dim::Dim(&local_8c,x_20);
      auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
      local_b8 = auVar6;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::
      emplace_back<dynet::Parameter>(local_68,(Parameter *)local_b8);
    }
    else {
      x_21._M_len = 2;
      x_21._M_array = &local_a0;
      local_9c = local_a0;
      Dim::Dim(&local_8c,x_21);
      auVar6 = dynet::Model::add_parameters((Dim *)model,0.0);
      local_b8 = auVar6;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::
      emplace_back<dynet::Parameter>(local_68,(Parameter *)local_b8);
    }
  }
  return;
}

Assistant:

AttentionalModel<Builder>::AttentionalModel(dynet::Model* model,
    unsigned vocab_size_src, unsigned _vocab_size_tgt, unsigned layers, unsigned hidden_dim, 
    unsigned align_dim, bool _rnn_src_embeddings, bool _giza_positional, 
    bool _giza_markov, bool _giza_fertility, bool _doc_context,
    bool _global_fertility)
: builder(layers, (_rnn_src_embeddings) ? 3*hidden_dim : 2*hidden_dim, hidden_dim, *model),
  builder_src_fwd(1, hidden_dim, hidden_dim, *model),
  builder_src_bwd(1, hidden_dim, hidden_dim, *model),
  rnn_src_embeddings(_rnn_src_embeddings), 
  giza_positional(_giza_positional), giza_markov(_giza_markov), giza_fertility(_giza_fertility),
  doc_context(_doc_context),
  global_fertility(_global_fertility),
  vocab_size_tgt(_vocab_size_tgt),
  num_aux_vecs(0)
{
    //std::cerr << "Attentionalmodel(" << vocab_size_src  << " " <<  _vocab_size_tgt  << " " <<  layers  << " " <<  hidden_dim << " " <<  align_dim  << " " <<  _rnn_src_embeddings  << " " <<  _giza_extentions  << " " <<  _doc_context << ")\n";
    
    p_cs = model->add_lookup_parameters(vocab_size_src, {hidden_dim}); 
    p_ct = model->add_lookup_parameters(vocab_size_tgt, {hidden_dim}); 
    p_R = model->add_parameters({vocab_size_tgt, hidden_dim});
    p_P = model->add_parameters({hidden_dim, hidden_dim});
    p_bias = model->add_parameters({vocab_size_tgt});
    p_Wa = model->add_parameters({align_dim, layers*hidden_dim});
    if (rnn_src_embeddings) {
        p_Ua = model->add_parameters({align_dim, 2*hidden_dim});
	p_Q = model->add_parameters({hidden_dim, 2*hidden_dim});
    } else {
        p_Ua = model->add_parameters({align_dim, hidden_dim});
	p_Q = model->add_parameters({hidden_dim, hidden_dim});
    }
    if (giza_positional || giza_markov || giza_fertility) {
        int num_giza = 0;
        if (giza_positional) num_giza += 3;
        if (giza_markov) num_giza += 3;
        if (giza_fertility) num_giza += 3;
        p_Ta = model->add_parameters({align_dim, (unsigned int)num_giza});
    }
    p_va = model->add_parameters({align_dim});

    if (doc_context) {
        if (rnn_src_embeddings) {
            p_S = model->add_parameters({hidden_dim, 2*hidden_dim});
        } else {
            p_S = model->add_parameters({hidden_dim, hidden_dim});
        }
    }

    if (global_fertility) {
        if (rnn_src_embeddings) {
            p_Wfhid = model->add_parameters({hidden_dim, 2*hidden_dim});
        } else {
            p_Wfhid = model->add_parameters({hidden_dim, hidden_dim});
        }
        p_bfhid = model->add_parameters({hidden_dim});
        p_Wfmu = model->add_parameters({hidden_dim});
        p_bfmu = model->add_parameters({1});
        p_Wfvar = model->add_parameters({hidden_dim});
        p_bfvar = model->add_parameters({1});
    }

    int hidden_layers = builder.num_h0_components();
    for (int l = 0; l < hidden_layers; ++l) {
	if (rnn_src_embeddings)
	    p_Wh0.push_back(model->add_parameters({hidden_dim, 2*hidden_dim}));
	else
	    p_Wh0.push_back(model->add_parameters({hidden_dim, hidden_dim}));
    }
}